

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_reflect_has(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSAtom prop;
  int iVar2;
  undefined4 in_register_0000000c;
  JSValueUnion JVar3;
  JSValue obj;
  JSValue JVar4;
  int64_t iStack_30;
  
  iVar1 = argv->tag;
  if ((int)iVar1 == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    prop = JS_ValueToAtom(ctx,argv[1]);
    iStack_30 = 6;
    if (prop != 0) {
      obj.tag = iVar1;
      obj.u = (JSValueUnion)(JSValueUnion)JVar3.ptr;
      iVar2 = JS_HasProperty(ctx,obj,prop);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar2) {
        JVar3._1_7_ = 0;
        JVar3.int32._0_1_ = iVar2 != 0;
        iStack_30 = 1;
        goto LAB_0010f1f6;
      }
    }
    JVar3.float64 = 0.0;
  }
  else {
    JVar3.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    iStack_30 = 6;
  }
LAB_0010f1f6:
  JVar4.tag = iStack_30;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_reflect_has(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop;
    JSAtom atom;
    int ret;

    obj = argv[0];
    prop = argv[1];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_HasProperty(ctx, obj, atom);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}